

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil_time.c
# Opt level: O1

evutil_monotonic_timer * evutil_monotonic_timer_new(void)

{
  evutil_monotonic_timer *peVar1;
  
  peVar1 = (evutil_monotonic_timer *)event_mm_malloc_(0x28);
  if (peVar1 != (evutil_monotonic_timer *)0x0) {
    (peVar1->adjust_monotonic_clock).tv_usec = 0;
    (peVar1->last_time).tv_sec = 0;
    *(undefined8 *)peVar1 = 0;
    (peVar1->adjust_monotonic_clock).tv_sec = 0;
    (peVar1->last_time).tv_usec = 0;
  }
  return peVar1;
}

Assistant:

struct evutil_monotonic_timer *
evutil_monotonic_timer_new(void)
{
  struct evutil_monotonic_timer *p = NULL;

  p = mm_malloc(sizeof(*p));
  if (!p) goto done;

  memset(p, 0, sizeof(*p));

 done:
  return p;
}